

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::verifyTestResult
          (TestStatus *__return_storage_ptr__,ComputeCacheTestInstance *this)

{
  Allocation *pAVar1;
  DeviceInterface *vkd;
  VkDevice device;
  long lVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  vkd = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  pAVar1 = this->m_outputBufferAlloc[0].
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,0x800);
  pAVar1 = this->m_outputBufferAlloc[1].
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,0x800);
  lVar2 = 0;
  do {
    if (*(char *)((long)(this->m_outputBufferAlloc[0].
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                         m_data.ptr)->m_hostPtr + lVar2) !=
        *(char *)((long)(this->m_outputBufferAlloc[1].
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                         m_data.ptr)->m_hostPtr + lVar2)) {
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Output buffers w/o cached pipeline mismatch.","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_40,local_38 + (long)local_40
                );
      goto LAB_004a865f;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x800);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Output buffers w/o cached pipeline match.","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_40,local_38 + (long)local_40);
LAB_004a865f:
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ComputeCacheTestInstance::verifyTestResult (void)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Read the content of output buffers
	invalidateMappedMemoryRange(vk,
								vkDevice,
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_NO_CACHE]->getMemory(),
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_NO_CACHE]->getOffset(),
								sizeof(tcu::Vec4) * 128u);

	invalidateMappedMemoryRange(vk,
								vkDevice,
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_CACHED]->getMemory(),
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_CACHED]->getOffset(),
								sizeof(tcu::Vec4) * 128u);
	// Compare the content
	deUint8* bufNoCache = reinterpret_cast<deUint8*>(m_outputBufferAlloc[PIPELINE_CACHE_NDX_NO_CACHE]->getHostPtr());
	deUint8* bufCached  = reinterpret_cast<deUint8*>(m_outputBufferAlloc[PIPELINE_CACHE_NDX_CACHED]->getHostPtr());
	for (deUint32 ndx = 0u; ndx < sizeof(tcu::Vec4) * 128u; ndx++)
	{
		if (bufNoCache[ndx] != bufCached[ndx])
		{
			return tcu::TestStatus::fail("Output buffers w/o cached pipeline mismatch.");
		}
	}

	return tcu::TestStatus::pass("Output buffers w/o cached pipeline match.");
}